

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::build_sampled_image(Impl *this,Id image_id,Id sampler_id,bool comparison)

{
  anon_class_24_3_1192cb61_for__M_pred __pred;
  bool bVar1;
  Id type_id;
  mapped_type *pmVar2;
  pointer pCVar3;
  byte local_a9;
  value_type local_a8;
  Id local_98;
  Id local_94;
  initializer_list<unsigned_int> local_90;
  Operation *local_80;
  Operation *op;
  Id sampled_format;
  bool multisampled;
  Id IStack_6c;
  bool arrayed;
  Dim dim;
  Id image_type_id;
  Builder *builder;
  undefined1 *local_58;
  Id *local_50;
  bool *local_48;
  CombinedImageSampler *local_40;
  __normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
  local_38;
  __normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
  local_30;
  __normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
  itr;
  Id local_20;
  bool is_non_uniform;
  Id IStack_1c;
  bool comparison_local;
  Id sampler_id_local;
  Id image_id_local;
  Impl *this_local;
  
  itr._M_current._7_1_ = comparison;
  local_20 = sampler_id;
  IStack_1c = image_id;
  _sampler_id_local = this;
  pmVar2 = std::
           unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
           ::operator[](&this->handle_to_resource_meta,&stack0xffffffffffffffe4);
  local_a9 = 1;
  if ((pmVar2->non_uniform & 1U) == 0) {
    pmVar2 = std::
             unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
             ::operator[](&this->handle_to_resource_meta,&local_20);
    local_a9 = pmVar2->non_uniform;
  }
  itr._M_current._6_1_ = local_a9 & 1;
  local_38._M_current =
       (CombinedImageSampler *)
       std::
       vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
       ::begin(&this->combined_image_sampler_cache);
  local_40 = (CombinedImageSampler *)
             std::
             vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
             ::end(&this->combined_image_sampler_cache);
  local_58 = (undefined1 *)&stack0xffffffffffffffe4;
  local_50 = &local_20;
  local_48 = (bool *)((long)&itr._M_current + 6);
  __pred.sampler_id._0_4_ = (int)local_50;
  __pred.image_id = (Id *)local_58;
  __pred.sampler_id._4_4_ = (int)((ulong)local_50 >> 0x20);
  __pred.is_non_uniform = local_48;
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler*,std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>>>,dxil_spv::Converter::Impl::build_sampled_image(unsigned_int,unsigned_int,bool)::__0>
                       (local_38,(__normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
                                  )local_40,__pred);
  builder = (Builder *)
            std::
            vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
            ::end(&this->combined_image_sampler_cache);
  bVar1 = __gnu_cxx::operator!=
                    (&local_30,
                     (__normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
                      *)&builder);
  if (bVar1) {
    pCVar3 = __gnu_cxx::
             __normal_iterator<dxil_spv::Converter::Impl::CombinedImageSampler_*,_std::vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>_>
             ::operator->(&local_30);
    this_local._4_4_ = pCVar3->combined_id;
  }
  else {
    _dim = SPIRVModule::get_builder(this->spirv_module);
    IStack_6c = get_type_id(this,IStack_1c);
    sampled_format = spv::Builder::getTypeDimensionality(_dim,IStack_6c);
    op._7_1_ = spv::Builder::isArrayedImageType(_dim,IStack_6c);
    op._6_1_ = spv::Builder::isMultisampledImageType(_dim,IStack_6c);
    op._0_4_ = spv::Builder::getImageComponentType(_dim,IStack_6c);
    IStack_6c = spv::Builder::makeImageType
                          (_dim,(Id)op,sampled_format,(bool)(itr._M_current._7_1_ & 1),
                           (bool)(op._7_1_ & 1),(bool)(op._6_1_ & 1),1,ImageFormatUnknown);
    type_id = spv::Builder::makeSampledImageType(_dim,IStack_6c);
    local_80 = allocate(this,OpSampledImage,type_id);
    local_98 = IStack_1c;
    local_94 = local_20;
    local_90._M_array = &local_98;
    local_90._M_len = 2;
    Operation::add_ids(local_80,&local_90);
    add(this,local_80,false);
    if ((itr._M_current._6_1_ & 1) != 0) {
      spv::Builder::addDecoration(_dim,local_80->id,DecorationNonUniform,-1);
      local_80->flags = local_80->flags | 1;
    }
    local_a8.image_id = IStack_1c;
    local_a8.sampler_id = local_20;
    local_a8.combined_id = local_80->id;
    local_a8.non_uniform = (bool)(itr._M_current._6_1_ & 1);
    std::
    vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
    ::push_back(&this->combined_image_sampler_cache,&local_a8);
    this_local._4_4_ = local_80->id;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::build_sampled_image(spv::Id image_id, spv::Id sampler_id, bool comparison)
{
	bool is_non_uniform =
	    handle_to_resource_meta[image_id].non_uniform || handle_to_resource_meta[sampler_id].non_uniform;

	auto itr = std::find_if(combined_image_sampler_cache.begin(), combined_image_sampler_cache.end(),
	                        [&](const CombinedImageSampler &combined) {
		                        return combined.image_id == image_id && combined.sampler_id == sampler_id &&
		                               combined.non_uniform == is_non_uniform;
	                        });

	if (itr != combined_image_sampler_cache.end())
		return itr->combined_id;

	auto &builder = spirv_module.get_builder();
	spv::Id image_type_id = get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool arrayed = builder.isArrayedImageType(image_type_id);
	bool multisampled = builder.isMultisampledImageType(image_type_id);
	spv::Id sampled_format = builder.getImageComponentType(image_type_id);

	image_type_id =
	    builder.makeImageType(sampled_format, dim, comparison, arrayed, multisampled, 1, spv::ImageFormatUnknown);

	Operation *op = allocate(spv::OpSampledImage, builder.makeSampledImageType(image_type_id));
	op->add_ids({ image_id, sampler_id });
	add(op);

	if (is_non_uniform)
	{
		builder.addDecoration(op->id, spv::DecorationNonUniformEXT);
		op->flags |= Operation::SinkableBit;
	}

	combined_image_sampler_cache.push_back({ image_id, sampler_id, op->id, is_non_uniform });
	return op->id;
}